

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtzone.cpp
# Opt level: O1

void __thiscall
icu_63::VTimeZone::writeFinalRule
          (VTimeZone *this,VTZWriter *writer,UBool isDst,AnnualTimeZoneRule *rule,
          int32_t fromRawOffset,int32_t fromDSTSavings,UDate startTime,UErrorCode *status)

{
  uint uVar1;
  bool bVar2;
  TimeRuleType TVar3;
  int32_t iVar4;
  uint month;
  int iVar5;
  DateRuleType DVar6;
  int32_t iVar7;
  int32_t iVar8;
  DateTimeRule *pDVar9;
  DateTimeRule *this_00;
  VTZWriter *size;
  int iVar10;
  int local_a8;
  UDate local_a0;
  int local_94;
  UnicodeString name;
  
  if (U_ZERO_ERROR < *status) {
    return;
  }
  size = writer;
  pDVar9 = AnnualTimeZoneRule::getRule(rule);
  TVar3 = DateTimeRule::getTimeRuleType(pDVar9);
  if (TVar3 != WALL_TIME) {
    iVar4 = DateTimeRule::getRuleMillisInDay(pDVar9);
    TVar3 = DateTimeRule::getTimeRuleType(pDVar9);
    if (TVar3 == UTC_TIME) {
      local_a8 = fromDSTSavings + fromRawOffset;
    }
    else {
      TVar3 = DateTimeRule::getTimeRuleType(pDVar9);
      local_a8 = 0;
      if (TVar3 == STANDARD_TIME) {
        local_a8 = fromDSTSavings;
      }
    }
    local_a8 = local_a8 + iVar4;
    if (local_a8 < 0) {
      local_a8 = local_a8 + 86400000;
      local_94 = -1;
LAB_0020f0e3:
      bVar2 = false;
    }
    else {
      if (86399999 < local_a8) {
        local_a8 = local_a8 + -86400000;
        local_94 = 1;
        goto LAB_0020f0e3;
      }
      local_94 = 0;
      bVar2 = true;
    }
    month = DateTimeRule::getRuleMonth(pDVar9);
    iVar5 = DateTimeRule::getRuleDayOfMonth(pDVar9);
    iVar4 = DateTimeRule::getRuleDayOfWeek(pDVar9);
    DVar6 = DateTimeRule::getDateRuleType(pDVar9);
    if (!bVar2) {
      if (DVar6 == DOW) {
        iVar7 = DateTimeRule::getRuleWeekInMonth(pDVar9);
        if (iVar7 < 1) {
          iVar5 = iVar7 * 7 + *(int *)(MONTHLENGTH + (long)(int)month * 4) + 7;
          DVar6 = DOW_LEQ_DOM;
        }
        else {
          iVar5 = iVar7 * 7 + -6;
          DVar6 = DOW_GEQ_DOM;
        }
      }
      iVar5 = iVar5 + local_94;
      if (iVar5 == 0) {
        uVar1 = month - 1;
        bVar2 = 0 < (int)month;
        month = 0xb;
        if (bVar2) {
          month = uVar1;
        }
        size = (VTZWriter *)(long)(int)month;
        iVar5 = *(int *)(MONTHLENGTH + (long)size * 4);
      }
      else {
        size = (VTZWriter *)(long)(int)month;
        if (*(int *)(MONTHLENGTH + (long)size * 4) < iVar5) {
          uVar1 = month + 1;
          size = (VTZWriter *)(ulong)uVar1;
          bVar2 = (int)month < 0xb;
          month = 0;
          if (bVar2) {
            month = uVar1;
          }
          iVar5 = 1;
        }
      }
      if (DVar6 == DOM) {
        DVar6 = DOM;
      }
      else {
        iVar10 = iVar4 + local_94;
        if (iVar10 == 0 || SCARRY4(iVar4,local_94) != iVar10 < 0) {
          iVar4 = 7;
        }
        else {
          iVar4 = iVar10;
          if (7 < iVar10) {
            iVar4 = 1;
          }
        }
      }
    }
    pDVar9 = (DateTimeRule *)UMemory::operator_new((UMemory *)0x28,(size_t)size);
    if (DVar6 == DOM) {
      if (pDVar9 != (DateTimeRule *)0x0) {
        DateTimeRule::DateTimeRule(pDVar9,month,iVar5,local_a8,WALL_TIME);
        goto LAB_0020f23c;
      }
    }
    else if (pDVar9 != (DateTimeRule *)0x0) {
      DateTimeRule::DateTimeRule(pDVar9,month,iVar5,iVar4,DVar6 == DOW_GEQ_DOM,local_a8,WALL_TIME);
      goto LAB_0020f23c;
    }
  }
  pDVar9 = (DateTimeRule *)0x0;
LAB_0020f23c:
  this_00 = pDVar9;
  if (pDVar9 == (DateTimeRule *)0x0) {
    this_00 = AnnualTimeZoneRule::getRule(rule);
  }
  iVar4 = DateTimeRule::getRuleMillisInDay(this_00);
  if (iVar4 < 0) {
    local_a0 = startTime + (double)-iVar4;
  }
  else {
    local_a0 = startTime;
    if (86399999 < iVar4) {
      local_a0 = startTime - (double)(iVar4 + -86399999);
    }
  }
  iVar4 = TimeZoneRule::getRawOffset(&rule->super_TimeZoneRule);
  iVar7 = TimeZoneRule::getDSTSavings(&rule->super_TimeZoneRule);
  name.super_Replaceable.super_UObject._vptr_UObject = (UObject)&PTR__UnicodeString_003e7ab8;
  name.fUnion.fStackFields.fLengthAndFlags = 2;
  TimeZoneRule::getName(&rule->super_TimeZoneRule,&name);
  DVar6 = DateTimeRule::getDateRuleType(this_00);
  if (DVar6 < 4) {
    iVar5 = iVar7 + iVar4;
    switch(DVar6) {
    case DOM:
      iVar4 = DateTimeRule::getRuleMonth(this_00);
      iVar7 = DateTimeRule::getRuleDayOfMonth(this_00);
      writeZonePropsByDOM(this,writer,isDst,&name,fromDSTSavings + fromRawOffset,iVar5,iVar4,iVar7,
                          local_a0,1.838821689216e+17,status);
      break;
    case DOW:
      iVar4 = DateTimeRule::getRuleMonth(this_00);
      iVar7 = DateTimeRule::getRuleWeekInMonth(this_00);
      iVar8 = DateTimeRule::getRuleDayOfWeek(this_00);
      writeZonePropsByDOW(this,writer,isDst,&name,fromDSTSavings + fromRawOffset,iVar5,iVar4,iVar7,
                          iVar8,local_a0,1.838821689216e+17,status);
      break;
    case DOW_GEQ_DOM:
      iVar4 = DateTimeRule::getRuleMonth(this_00);
      iVar7 = DateTimeRule::getRuleDayOfMonth(this_00);
      iVar8 = DateTimeRule::getRuleDayOfWeek(this_00);
      writeZonePropsByDOW_GEQ_DOM
                (this,writer,isDst,&name,fromDSTSavings + fromRawOffset,iVar5,iVar4,iVar7,iVar8,
                 local_a0,1.838821689216e+17,status);
      break;
    case DOW_LEQ_DOM:
      iVar4 = DateTimeRule::getRuleMonth(this_00);
      iVar7 = DateTimeRule::getRuleDayOfMonth(this_00);
      iVar8 = DateTimeRule::getRuleDayOfWeek(this_00);
      writeZonePropsByDOW_LEQ_DOM
                (this,writer,isDst,&name,fromDSTSavings + fromRawOffset,iVar5,iVar4,iVar7,iVar8,
                 local_a0,1.838821689216e+17,status);
    }
  }
  if (pDVar9 != (DateTimeRule *)0x0) {
    (*(this_00->super_UObject)._vptr_UObject[1])(this_00);
  }
  UnicodeString::~UnicodeString(&name);
  return;
}

Assistant:

void
VTimeZone::writeFinalRule(VTZWriter& writer, UBool isDst, const AnnualTimeZoneRule* rule,
                          int32_t fromRawOffset, int32_t fromDSTSavings,
                          UDate startTime, UErrorCode& status) const {
    if (U_FAILURE(status)) {
        return;
    }
    UBool modifiedRule = TRUE;
    const DateTimeRule *dtrule = toWallTimeRule(rule->getRule(), fromRawOffset, fromDSTSavings);
    if (dtrule == NULL) {
        modifiedRule = FALSE;
        dtrule = rule->getRule();
    }

    // If the rule's mills in a day is out of range, adjust start time.
    // Olson tzdata supports 24:00 of a day, but VTIMEZONE does not.
    // See ticket#7008/#7518

    int32_t timeInDay = dtrule->getRuleMillisInDay();
    if (timeInDay < 0) {
        startTime = startTime + (0 - timeInDay);
    } else if (timeInDay >= U_MILLIS_PER_DAY) {
        startTime = startTime - (timeInDay - (U_MILLIS_PER_DAY - 1));
    }

    int32_t toOffset = rule->getRawOffset() + rule->getDSTSavings();
    UnicodeString name;
    rule->getName(name);
    switch (dtrule->getDateRuleType()) {
    case DateTimeRule::DOM:
        writeZonePropsByDOM(writer, isDst, name, fromRawOffset + fromDSTSavings, toOffset,
                dtrule->getRuleMonth(), dtrule->getRuleDayOfMonth(), startTime, MAX_MILLIS, status);
        break;
    case DateTimeRule::DOW:
        writeZonePropsByDOW(writer, isDst, name, fromRawOffset + fromDSTSavings, toOffset,
                dtrule->getRuleMonth(), dtrule->getRuleWeekInMonth(), dtrule->getRuleDayOfWeek(), startTime, MAX_MILLIS, status);
        break;
    case DateTimeRule::DOW_GEQ_DOM:
        writeZonePropsByDOW_GEQ_DOM(writer, isDst, name, fromRawOffset + fromDSTSavings, toOffset,
                dtrule->getRuleMonth(), dtrule->getRuleDayOfMonth(), dtrule->getRuleDayOfWeek(), startTime, MAX_MILLIS, status);
        break;
    case DateTimeRule::DOW_LEQ_DOM:
        writeZonePropsByDOW_LEQ_DOM(writer, isDst, name, fromRawOffset + fromDSTSavings, toOffset,
                dtrule->getRuleMonth(), dtrule->getRuleDayOfMonth(), dtrule->getRuleDayOfWeek(), startTime, MAX_MILLIS, status);
        break;
    }
    if (modifiedRule) {
        delete dtrule;
    }
}